

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O1

ObjectSplit * __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_object_find
          (ObjectSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize,SplitInfo *info)

{
  BBox3fa *pBVar1;
  int *piVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  PrimRef *pPVar9;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  size_t sVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar24;
  uint *puVar25;
  ulong uVar26;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar27;
  long lVar28;
  float fVar29;
  uint uVar30;
  uint uVar32;
  uint uVar33;
  float fVar34;
  undefined1 auVar31 [16];
  uint uVar35;
  uint uVar38;
  float fVar39;
  uint uVar40;
  float fVar42;
  undefined1 auVar36 [16];
  uint uVar41;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar37;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar48;
  uint uVar50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar49;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar51;
  uint uVar52;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar60 [16];
  vuint4 vbestPos;
  BinMapping<32UL> mapping;
  ObjectBinner binner;
  vuint4 rCounts [32];
  vfloat4 rAreas [32];
  undefined8 local_1320;
  ulong local_1300;
  undefined1 local_12d0 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_12c0;
  ulong local_12b0;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float local_1290 [3];
  uint uStack_1284;
  undefined8 local_1280 [2];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1230 [186];
  int aiStack_690 [4];
  undefined8 local_680;
  int local_678 [122];
  int aiStack_490 [8];
  int aiStack_470 [120];
  undefined8 uStack_290;
  float afStack_288 [6];
  float afStack_270 [144];
  
  lVar15 = 0xc00;
  paVar24 = local_1230;
  do {
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)paVar24[-1].m128 = _DAT_01feb9f0;
    *paVar24 = _DAT_01feba00;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)paVar24[-3].m128 = _DAT_01feb9f0;
    paVar24[-2] = _DAT_01feba00;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)paVar24[-5].m128 = _DAT_01feb9f0;
    paVar24[-4] = _DAT_01feba00;
    *(undefined8 *)((long)local_1280 + lVar15) = 0;
    *(undefined8 *)((long)local_1280 + lVar15 + 8) = 0;
    lVar15 = lVar15 + 0x10;
    paVar24 = paVar24 + 6;
  } while (lVar15 != 0xe00);
  uVar7 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar8 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  fVar29 = (float)(uVar8 - uVar7) * 0.05 + 4.0;
  uVar16 = (ulong)fVar29;
  uVar16 = (long)(fVar29 - 9.223372e+18) & (long)uVar16 >> 0x3f | uVar16;
  local_12b0 = 0x20;
  if (uVar16 < 0x20) {
    local_12b0 = uVar16;
  }
  pBVar1 = &(set->super_CentGeomBBox3fa).centBounds;
  local_12a0 = (pBVar1->lower).field_0.m128[0];
  fStack_129c = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[1];
  uVar13 = *(undefined8 *)&(pBVar1->lower).field_0;
  pfVar12 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128 + 2;
  fStack_1298 = *pfVar12;
  fStack_1294 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[3];
  uVar14 = *(undefined8 *)pfVar12;
  auVar36._0_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[0] - local_12a0;
  auVar36._4_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[1] - fStack_129c;
  auVar36._8_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[2] - fStack_1298;
  auVar36._12_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[3] - fStack_1294;
  auVar31._0_4_ = (float)(long)local_12b0 * 0.99;
  auVar60 = maxps(_DAT_01fecb10,auVar36);
  auVar31._4_4_ = auVar31._0_4_;
  auVar31._8_4_ = auVar31._0_4_;
  auVar31._12_4_ = auVar31._0_4_;
  auVar36 = divps(auVar31,auVar60);
  local_1290[0] = (float)(-(uint)((float)DAT_01fecb10 < auVar60._0_4_) & auVar36._0_4_);
  local_1290[1] = (float)(-(uint)(DAT_01fecb10._4_4_ < auVar60._4_4_) & auVar36._4_4_);
  local_1290[2] = (float)(-(uint)(DAT_01fecb10._8_4_ < auVar60._8_4_) & auVar36._8_4_);
  uStack_1284 = -(uint)(DAT_01fecb10._12_4_ < auVar60._12_4_) & auVar36._12_4_;
  uVar26 = uVar8 - uVar7;
  if (uVar26 != 0) {
    pPVar9 = this->prims0;
    if (uVar26 == 1) {
      uVar22 = 0;
    }
    else {
      uVar18 = (int)local_12b0 - 1;
      paVar27 = &pPVar9[uVar7 + 1].upper.field_0;
      uVar22 = 0;
      do {
        aVar3 = paVar27[-3].field_1;
        aVar4 = paVar27[-2].field_1;
        uVar30 = (uint)(((aVar3.x + aVar4.x) - local_12a0) * local_1290[0] + -0.5);
        uVar32 = (uint)(((aVar3.y + aVar4.y) - fStack_129c) * local_1290[1] + -0.5);
        uVar33 = (uint)(((aVar3.z + aVar4.z) - fStack_1298) * local_1290[2] + -0.5);
        uVar35 = -(uint)((int)uVar18 < (int)uVar30);
        uVar38 = -(uint)((int)uVar18 < (int)uVar32);
        uVar40 = -(uint)((int)uVar18 < (int)uVar33);
        aVar5 = paVar27[-1].field_1;
        uVar35 = ~uVar35 & uVar30 | uVar18 & uVar35;
        uVar50 = ~uVar38 & uVar32 | uVar18 & uVar38;
        uVar52 = ~uVar40 & uVar33 | uVar18 & uVar40;
        aVar6 = paVar27->field_1;
        uVar30 = (uint)(((aVar5.x + aVar6.x) - local_12a0) * local_1290[0] + -0.5);
        uVar32 = (uint)(((aVar5.y + aVar6.y) - fStack_129c) * local_1290[1] + -0.5);
        uVar33 = (uint)(((aVar5.z + aVar6.z) - fStack_1298) * local_1290[2] + -0.5);
        uVar38 = -(uint)((int)uVar18 < (int)uVar30);
        uVar40 = -(uint)((int)uVar18 < (int)uVar32);
        uVar41 = -(uint)((int)uVar18 < (int)uVar33);
        uVar30 = ~uVar38 & uVar30 | uVar18 & uVar38;
        uVar32 = ~uVar40 & uVar32 | uVar18 & uVar40;
        uVar33 = ~uVar41 & uVar33 | uVar18 & uVar41;
        uVar20 = (ulong)(-(uint)(0 < (int)uVar35) & uVar35);
        auVar36 = *(undefined1 (*) [16])(local_1270 + uVar20 * 0x60);
        auVar31 = minps(*(undefined1 (*) [16])(local_1280 + uVar20 * 0xc),(undefined1  [16])aVar3);
        *(undefined1 (*) [16])(local_1280 + uVar20 * 0xc) = auVar31;
        auVar36 = maxps(auVar36,(undefined1  [16])aVar4);
        *(undefined1 (*) [16])(local_1270 + uVar20 * 0x60) = auVar36;
        uVar10 = (ulong)(-(uint)(0 < (int)uVar50) & uVar50);
        lVar15 = uVar10 * 0x60;
        auVar36 = minps(*(undefined1 (*) [16])(local_1260 + lVar15),(undefined1  [16])aVar3);
        auVar31 = maxps(*(undefined1 (*) [16])(local_1250 + lVar15),(undefined1  [16])aVar4);
        *(undefined1 (*) [16])(local_1260 + lVar15) = auVar36;
        uVar11 = (ulong)(-(uint)(0 < (int)uVar52) & uVar52);
        *(undefined1 (*) [16])(local_1250 + lVar15) = auVar31;
        aVar37 = local_1230[uVar11 * 6];
        auVar36 = minps(*(undefined1 (*) [16])(local_1240 + uVar11 * 0x60),(undefined1  [16])aVar3);
        *(undefined1 (*) [16])(local_1240 + uVar11 * 0x60) = auVar36;
        aVar37.m128 = (__m128)maxps(aVar37.m128,(undefined1  [16])aVar4);
        local_1230[uVar11 * 6] = aVar37;
        *(int *)(&local_680 + uVar20 * 2) = *(int *)(&local_680 + uVar20 * 2) + 1;
        piVar2 = (int *)((long)&local_680 + uVar10 * 0x10 + 4);
        *piVar2 = *piVar2 + 1;
        uVar20 = (ulong)(-(uint)(0 < (int)uVar30) & uVar30);
        local_678[uVar11 * 4] = local_678[uVar11 * 4] + 1;
        auVar36 = minps(*(undefined1 (*) [16])(local_1280 + uVar20 * 0xc),(undefined1  [16])aVar5);
        auVar31 = maxps(*(undefined1 (*) [16])(local_1270 + uVar20 * 0x60),(undefined1  [16])aVar6);
        *(undefined1 (*) [16])(local_1280 + uVar20 * 0xc) = auVar36;
        uVar10 = (ulong)(-(uint)(0 < (int)uVar32) & uVar32);
        lVar15 = uVar10 * 0x60;
        *(undefined1 (*) [16])(local_1270 + uVar20 * 0x60) = auVar31;
        auVar36 = minps(*(undefined1 (*) [16])(local_1260 + lVar15),(undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_1260 + lVar15) = auVar36;
        auVar36 = maxps(*(undefined1 (*) [16])(local_1250 + lVar15),(undefined1  [16])aVar6);
        uVar11 = (ulong)(-(uint)(0 < (int)uVar33) & uVar33);
        *(undefined1 (*) [16])(local_1250 + lVar15) = auVar36;
        aVar37 = local_1230[uVar11 * 6];
        auVar36 = minps(*(undefined1 (*) [16])(local_1240 + uVar11 * 0x60),(undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_1240 + uVar11 * 0x60) = auVar36;
        aVar37.m128 = (__m128)maxps(aVar37.m128,(undefined1  [16])aVar6);
        local_1230[uVar11 * 6] = aVar37;
        *(int *)(&local_680 + uVar20 * 2) = *(int *)(&local_680 + uVar20 * 2) + 1;
        piVar2 = (int *)((long)&local_680 + uVar10 * 0x10 + 4);
        *piVar2 = *piVar2 + 1;
        local_678[uVar11 * 4] = local_678[uVar11 * 4] + 1;
        uVar22 = uVar22 + 2;
        paVar27 = paVar27 + 4;
      } while (uVar22 < uVar26 - 1);
    }
    if (uVar22 < uVar26) {
      aVar3 = pPVar9[uVar7 + uVar22].lower.field_0.field_1;
      aVar4 = pPVar9[uVar7 + uVar22].upper.field_0.field_1;
      uVar30 = (uint)(((aVar3.x + aVar4.x) - local_12a0) * local_1290[0] + -0.5);
      uVar32 = (uint)(((aVar3.y + aVar4.y) - fStack_129c) * local_1290[1] + -0.5);
      uVar33 = (uint)(((aVar3.z + aVar4.z) - fStack_1298) * local_1290[2] + -0.5);
      uVar18 = (int)local_12b0 - 1;
      uVar35 = -(uint)((int)uVar18 < (int)uVar30);
      uVar38 = -(uint)((int)uVar18 < (int)uVar32);
      uVar50 = -(uint)((int)uVar18 < (int)uVar33);
      uVar30 = ~uVar35 & uVar30 | uVar18 & uVar35;
      uVar32 = ~uVar38 & uVar32 | uVar18 & uVar38;
      uVar18 = ~uVar50 & uVar33 | uVar18 & uVar50;
      uVar26 = (ulong)(-(uint)(0 < (int)uVar30) & uVar30);
      *(int *)(&local_680 + uVar26 * 2) = *(int *)(&local_680 + uVar26 * 2) + 1;
      auVar36 = *(undefined1 (*) [16])(local_1270 + uVar26 * 0x60);
      auVar31 = minps(*(undefined1 (*) [16])(local_1280 + uVar26 * 0xc),(undefined1  [16])aVar3);
      *(undefined1 (*) [16])(local_1280 + uVar26 * 0xc) = auVar31;
      auVar36 = maxps(auVar36,(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1270 + uVar26 * 0x60) = auVar36;
      uVar26 = (ulong)(-(uint)(0 < (int)uVar32) & uVar32);
      piVar2 = (int *)((long)&local_680 + uVar26 * 0x10 + 4);
      *piVar2 = *piVar2 + 1;
      lVar15 = uVar26 * 0x60;
      auVar36 = minps(*(undefined1 (*) [16])(local_1260 + lVar15),(undefined1  [16])aVar3);
      *(undefined1 (*) [16])(local_1260 + lVar15) = auVar36;
      auVar36 = maxps(*(undefined1 (*) [16])(local_1250 + lVar15),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1250 + lVar15) = auVar36;
      uVar26 = (ulong)(-(uint)(0 < (int)uVar18) & uVar18);
      local_678[uVar26 * 4] = local_678[uVar26 * 4] + 1;
      aVar37 = local_1230[uVar26 * 6];
      auVar36 = minps(*(undefined1 (*) [16])(local_1240 + uVar26 * 0x60),(undefined1  [16])aVar3);
      *(undefined1 (*) [16])(local_1240 + uVar26 * 0x60) = auVar36;
      aVar37.m128 = (__m128)maxps(aVar37.m128,(undefined1  [16])aVar4);
      local_1230[uVar26 * 6] = aVar37;
    }
  }
  local_1320 = CONCAT44(local_1290[1],local_1290[0]);
  lVar15 = local_12b0 - 1;
  if (lVar15 != 0) {
    lVar17 = local_12b0 * 0x10;
    pauVar23 = (undefined1 (*) [16])(local_1290 + local_12b0 * 0x18);
    iVar44 = 0;
    iVar45 = 0;
    iVar46 = 0;
    iVar47 = 0;
    lVar28 = 0;
    aVar37 = _DAT_01feb9f0;
    aVar43 = _DAT_01feba00;
    aVar48 = _DAT_01feba00;
    aVar49 = _DAT_01feb9f0;
    aVar51 = _DAT_01feba00;
    aVar53 = _DAT_01feb9f0;
    do {
      piVar2 = (int *)((long)aiStack_690 + lVar28 + lVar17);
      iVar44 = iVar44 + *piVar2;
      iVar45 = iVar45 + piVar2[1];
      iVar46 = iVar46 + piVar2[2];
      iVar47 = iVar47 + piVar2[3];
      piVar2 = (int *)((long)aiStack_490 + lVar28 + lVar17);
      *piVar2 = iVar44;
      piVar2[1] = iVar45;
      piVar2[2] = iVar46;
      piVar2[3] = iVar47;
      aVar37.m128 = (__m128)minps(aVar37.m128,pauVar23[-5]);
      aVar43.m128 = (__m128)maxps(aVar43.m128,pauVar23[-4]);
      fVar29 = aVar43.m128[1] - aVar37.m128[1];
      fVar34 = aVar43.m128[2] - aVar37.m128[2];
      aVar49.m128 = (__m128)minps(aVar49.m128,pauVar23[-3]);
      aVar48.m128 = (__m128)maxps(aVar48.m128,pauVar23[-2]);
      fVar39 = aVar48.m128[1] - aVar49.m128[1];
      fVar42 = aVar48.m128[2] - aVar49.m128[2];
      *(ulong *)((long)&uStack_290 + lVar28 + lVar17) =
           CONCAT44((aVar48.m128[0] - aVar49.m128[0]) * (fVar39 + fVar42) + fVar42 * fVar39,
                    (aVar43.m128[0] - aVar37.m128[0]) * (fVar29 + fVar34) + fVar34 * fVar29);
      aVar53.m128 = (__m128)minps(aVar53.m128,pauVar23[-1]);
      aVar51.m128 = (__m128)maxps(aVar51.m128,*pauVar23);
      fVar29 = aVar51.m128[1] - aVar53.m128[1];
      fVar34 = aVar51.m128[2] - aVar53.m128[2];
      *(float *)((long)afStack_288 + lVar28 + lVar17) =
           (fVar29 + fVar34) * (aVar51.m128[0] - aVar53.m128[0]) + fVar34 * fVar29;
      *(undefined4 *)((long)afStack_288 + lVar28 + lVar17 + 4) = 0;
      lVar28 = lVar28 + -0x10;
      pauVar23 = pauVar23 + -6;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  uVar26 = 0xffffffff;
  local_12c0.m128 = _DAT_01feb9f0;
  local_12d0._0_4_ = 0;
  local_12d0._4_4_ = 0;
  local_12d0._8_4_ = 0;
  local_12d0._12_4_ = 0;
  local_12d0 = (undefined1  [16])0x0;
  if (1 < uVar16) {
    uVar18 = ~(-1 << ((byte)logBlockSize & 0x1f));
    paVar24 = local_1230;
    uVar30 = 1;
    uVar32 = 1;
    uVar33 = 1;
    uVar35 = 1;
    iVar44 = 0;
    iVar45 = 0;
    iVar46 = 0;
    iVar47 = 0;
    lVar15 = 0;
    local_12d0._0_4_ = 0;
    local_12d0._4_4_ = 0;
    local_12d0._8_4_ = 0;
    local_12d0._12_4_ = 0;
    aVar37 = _DAT_01feba00;
    aVar43 = _DAT_01feb9f0;
    aVar48 = _DAT_01feba00;
    aVar49 = _DAT_01feba00;
    aVar51 = _DAT_01feb9f0;
    aVar53 = _DAT_01feb9f0;
    do {
      aVar43.m128 = (__m128)minps(aVar43.m128,paVar24[-5]);
      aVar37.m128 = (__m128)maxps(aVar37.m128,paVar24[-4]);
      aVar51.m128 = (__m128)minps(aVar51.m128,paVar24[-3]);
      aVar49.m128 = (__m128)maxps(aVar49.m128,paVar24[-2]);
      fVar39 = aVar37.m128[1] - aVar43.m128[1];
      fVar42 = aVar37.m128[2] - aVar43.m128[2];
      aVar53.m128 = (__m128)minps(aVar53.m128,paVar24[-1]);
      fVar29 = aVar49.m128[1] - aVar51.m128[1];
      fVar34 = aVar49.m128[2] - aVar51.m128[2];
      aVar48.m128 = (__m128)maxps(aVar48.m128,*paVar24);
      fVar57 = aVar48.m128[0] - aVar53.m128[0];
      fVar58 = aVar48.m128[1] - aVar53.m128[1];
      fVar59 = aVar48.m128[2] - aVar53.m128[2];
      iVar44 = iVar44 + *(int *)((long)&local_680 + lVar15);
      iVar45 = iVar45 + *(int *)((long)&local_680 + lVar15 + 4);
      iVar46 = iVar46 + *(int *)((long)local_678 + lVar15);
      iVar47 = iVar47 + *(int *)((long)local_678 + lVar15 + 4);
      local_1300 = logBlockSize & 0xffffffff;
      uVar38 = iVar44 + uVar18 >> local_1300;
      uVar50 = iVar45 + uVar18 >> local_1300;
      uVar40 = iVar46 + uVar18 >> local_1300;
      uVar52 = iVar47 + uVar18 >> local_1300;
      uVar41 = *(int *)((long)aiStack_470 + lVar15) + uVar18 >> local_1300;
      uVar54 = *(int *)((long)aiStack_470 + lVar15 + 4) + uVar18 >> local_1300;
      uVar55 = *(int *)((long)aiStack_470 + lVar15 + 8) + uVar18 >> local_1300;
      uVar56 = *(int *)((long)aiStack_470 + lVar15 + 0xc) + uVar18 >> local_1300;
      auVar60._0_4_ =
           ((float)(uVar41 & 0x7fffffff) + (float)((int)uVar41 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_270 + lVar15) +
           ((float)(uVar38 & 0x7fffffff) + (float)((int)uVar38 >> 0x1f & 0x4f000000)) *
           ((aVar37.m128[0] - aVar43.m128[0]) * (fVar39 + fVar42) + fVar42 * fVar39);
      auVar60._4_4_ =
           ((float)(uVar54 & 0x7fffffff) + (float)((int)uVar54 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_270 + lVar15 + 4) +
           ((float)(uVar50 & 0x7fffffff) + (float)((int)uVar50 >> 0x1f & 0x4f000000)) *
           ((aVar49.m128[0] - aVar51.m128[0]) * (fVar29 + fVar34) + fVar34 * fVar29);
      auVar60._8_4_ =
           ((float)(uVar55 & 0x7fffffff) + (float)((int)uVar55 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_270 + lVar15 + 8) +
           ((float)(uVar40 & 0x7fffffff) + (float)((int)uVar40 >> 0x1f & 0x4f000000)) *
           (fVar57 * (fVar59 + fVar58) + fVar58 * fVar59);
      auVar60._12_4_ =
           ((float)(uVar56 & 0x7fffffff) + (float)((int)uVar56 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_270 + lVar15 + 0xc) +
           ((float)(uVar52 & 0x7fffffff) + (float)((int)uVar52 >> 0x1f & 0x4f000000)) *
           (fVar57 * (fVar58 + fVar59) + fVar59 * fVar58);
      uVar38 = -(uint)(local_12c0.m128[0] <= auVar60._0_4_);
      uVar50 = -(uint)(local_12c0.m128[1] <= auVar60._4_4_);
      uVar40 = -(uint)(local_12c0.m128[2] <= auVar60._8_4_);
      uVar52 = -(uint)(local_12c0.m128[3] <= auVar60._12_4_);
      local_12d0._0_4_ = ~uVar38 & uVar30 | local_12d0._0_4_ & uVar38;
      local_12d0._4_4_ = ~uVar50 & uVar32 | local_12d0._4_4_ & uVar50;
      local_12d0._8_4_ = ~uVar40 & uVar33 | local_12d0._8_4_ & uVar40;
      local_12d0._12_4_ = ~uVar52 & uVar35 | local_12d0._12_4_ & uVar52;
      local_12c0.m128 = (__m128)minps(auVar60,local_12c0.m128);
      uVar30 = uVar30 + 1;
      uVar32 = uVar32 + 1;
      uVar33 = uVar33 + 1;
      uVar35 = uVar35 + 1;
      paVar24 = paVar24 + 6;
      lVar15 = lVar15 + 0x10;
    } while (local_12b0 * 0x10 + -0x10 != lVar15);
  }
  fVar29 = INFINITY;
  uVar16 = 0;
  iVar44 = 0;
  do {
    if ((((local_1290[uVar16] != 0.0) || (NAN(local_1290[uVar16]))) &&
        (fVar34 = *(float *)((long)&local_12c0 + uVar16 * 4), fVar34 < fVar29)) &&
       (*(int *)(local_12d0 + uVar16 * 4) != 0)) {
      uVar26 = uVar16 & 0xffffffff;
      iVar44 = *(int *)(local_12d0 + uVar16 * 4);
      fVar29 = fVar34;
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 != 3);
  __return_storage_ptr__->sah = fVar29;
  iVar45 = (int)uVar26;
  __return_storage_ptr__->dim = iVar45;
  (__return_storage_ptr__->field_2).pos = iVar44;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = local_12b0;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = uVar13;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uVar14;
  *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 = local_1320;
  *(ulong *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) =
       CONCAT44(uStack_1284,local_1290[2]);
  if (iVar45 == -1) {
    info->leftCount = 0;
    aVar37 = _DAT_01feb9f0;
    info->rightCount = 0;
    (info->leftBounds).lower.field_0 = _DAT_01feb9f0;
    aVar43 = _DAT_01feba00;
    aVar48 = _DAT_01feba00;
  }
  else {
    uVar16 = (ulong)iVar44;
    lVar15 = (long)iVar45;
    aVar48 = _DAT_01feba00;
    aVar49 = _DAT_01feb9f0;
    if (iVar44 == 0) {
      sVar19 = 0;
    }
    else {
      puVar25 = (uint *)((long)&local_680 + lVar15 * 4);
      pauVar23 = (undefined1 (*) [16])(local_1270 + lVar15 * 0x20);
      sVar19 = 0;
      uVar26 = uVar16;
      do {
        aVar49.m128 = (__m128)minps(aVar49.m128,pauVar23[-1]);
        aVar48.m128 = (__m128)maxps(aVar48.m128,*pauVar23);
        sVar19 = sVar19 + *puVar25;
        puVar25 = puVar25 + 4;
        pauVar23 = pauVar23 + 6;
        uVar26 = uVar26 - 1;
      } while (uVar26 != 0);
    }
    lVar17 = local_12b0 - uVar16;
    aVar37 = _DAT_01feb9f0;
    aVar43 = _DAT_01feba00;
    if (local_12b0 < uVar16 || lVar17 == 0) {
      sVar21 = 0;
    }
    else {
      puVar25 = (uint *)((long)&local_680 + uVar16 * 0x10 + lVar15 * 4);
      pauVar23 = (undefined1 (*) [16])(local_1270 + lVar15 * 0x20 + uVar16 * 0x60);
      sVar21 = 0;
      do {
        aVar37.m128 = (__m128)minps(aVar37.m128,pauVar23[-1]);
        aVar43.m128 = (__m128)maxps(aVar43.m128,*pauVar23);
        sVar21 = sVar21 + *puVar25;
        puVar25 = puVar25 + 4;
        pauVar23 = pauVar23 + 6;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
    info->leftCount = sVar19;
    info->rightCount = sVar21;
    (info->leftBounds).lower.field_0 = aVar49;
  }
  (info->leftBounds).upper.field_0 = aVar48;
  (info->rightBounds).lower.field_0 = aVar37;
  (info->rightBounds).upper.field_0 = aVar43;
  return __return_storage_ptr__;
}

Assistant:

sequential_object_find(const PrimInfoExtRange& set, const size_t logBlockSize, SplitInfo &info)
        {
          ObjectBinner binner(empty); 
          const BinMapping<OBJECT_BINS> mapping(set);
          binner.bin(prims0,set.begin(),set.end(),mapping);
          ObjectSplit s = binner.best(mapping,logBlockSize);
          binner.getSplitInfo(mapping, s, info);
          return s;
        }